

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_decoder.c
# Opt level: O0

lzma_filter_decoder * decoder_find(lzma_vli id)

{
  ulong local_20;
  size_t i;
  lzma_vli id_local;
  
  local_20 = 0;
  while( true ) {
    if (8 < local_20) {
      return (lzma_filter_decoder *)0x0;
    }
    if (decoders[local_20].id == id) break;
    local_20 = local_20 + 1;
  }
  return decoders + local_20;
}

Assistant:

static const lzma_filter_decoder *
decoder_find(lzma_vli id)
{
	for (size_t i = 0; i < ARRAY_SIZE(decoders); ++i)
		if (decoders[i].id == id)
			return decoders + i;

	return NULL;
}